

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_jsr_w(ExecutionEngine *this)

{
  u4 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  uint uVar3;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar2 = Frame::getCode(this_01,this_01->pc);
  uVar3 = *(uint *)(puVar2 + 1);
  operand.data._0_4_ = this_01->pc + 5;
  operand.printType = BOOLEAN;
  operand.type = RETURN_ADDR;
  operand.data.longValue._4_4_ = 0;
  Frame::pushIntoOperandStack(this_01,operand);
  uVar3 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
          this_01->pc;
  this_01->pc = uVar3;
  uVar1 = Frame::sizeCode(this_01);
  if (uVar3 < uVar1) {
    return;
  }
  __assert_fail("topFrame->pc < (int32_t)topFrame->sizeCode()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x129f,"void ExecutionEngine::i_jsr_w()");
}

Assistant:

void ExecutionEngine::i_jsr_w() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1];
	u1 byte2 = code[2];
	u1 byte3 = code[3];
	u1 byte4 = code[4];
	int32_t branchOffset = (byte1 << 24) | (byte2 << 16) | (byte3 << 8)| byte4;

	Value returnAddr;
	returnAddr.type = ValueType::RETURN_ADDR;
	returnAddr.data.returnAddress = topFrame->pc + 5;
	topFrame->pushIntoOperandStack(returnAddr);

	topFrame->pc += branchOffset;
	assert(topFrame->pc < (int32_t)topFrame->sizeCode());
}